

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary.cc
# Opt level: O0

void LabelDict::add_example_namespace(example *ec,namespace_index ns,features *fs)

{
  bool bVar1;
  size_t sVar2;
  byte *pbVar3;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar4;
  features *pfVar5;
  float *pfVar6;
  v_array<float> *in_RDX;
  byte in_SIL;
  v_array<unsigned_char> *in_RDI;
  size_t i_1;
  features *add_fs;
  bool audit;
  size_t i;
  bool has_ns;
  uchar *in_stack_ffffffffffffff98;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *new_ele;
  v_array<unsigned_char> *in_stack_ffffffffffffffa0;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  float v;
  features *this_00;
  features *local_40;
  ulong local_28;
  
  bVar1 = false;
  local_28 = 0;
  do {
    sVar2 = v_array<unsigned_char>::size(in_RDI);
    if (sVar2 <= local_28) {
LAB_00396de9:
      if (!bVar1) {
        v_array<unsigned_char>::push_back(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      sVar2 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(in_RDX + 2));
      pvVar4 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)in_RDI + (ulong)in_SIL * 0x68 + 0x20);
      local_40 = (features *)0x0;
      while( true ) {
        this_00 = local_40;
        pfVar5 = (features *)features::size((features *)0x396e5a);
        if (pfVar5 <= this_00) break;
        this = pvVar4;
        pfVar6 = v_array<float>::operator[](in_RDX,(size_t)local_40);
        v = *pfVar6;
        v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RDX + 1),(size_t)local_40);
        features::push_back(this_00,v,(feature_index)this);
        if (sVar2 != 0) {
          new_ele = pvVar4 + 2;
          v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(in_RDX + 2),(size_t)local_40);
          v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back(this,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)new_ele);
        }
        local_40 = (features *)((long)&(local_40->values)._begin + 1);
      }
      *(float *)((long)&in_RDI[0x345].end_array + 4) =
           *(float *)&in_RDX[3]._begin + *(float *)((long)&in_RDI[0x345].end_array + 4);
      sVar2 = features::size((features *)0x396f25);
      in_RDI[0x345]._begin = in_RDI[0x345]._begin + sVar2;
      return;
    }
    pbVar3 = v_array<unsigned_char>::operator[](in_RDI,local_28);
    if (*pbVar3 == in_SIL) {
      bVar1 = true;
      goto LAB_00396de9;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void add_example_namespace(example& ec, namespace_index ns, features& fs)
{
  bool has_ns = false;
  for (size_t i = 0; i < ec.indices.size(); i++)
    if (ec.indices[i] == (size_t)ns)
    {
      has_ns = true;
      break;
    }

  if (!has_ns)
    ec.indices.push_back((size_t)ns);

  bool audit = fs.space_names.size() > 0;
  features& add_fs = ec.feature_space[(size_t)ns];
  for (size_t i = 0; i < fs.size(); ++i)
  {
    add_fs.push_back(fs.values[i], fs.indicies[i]);
    if (audit)
      add_fs.space_names.push_back(fs.space_names[i]);
  }
  ec.total_sum_feat_sq += fs.sum_feat_sq;

  ec.num_features += fs.size();
}